

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O0

Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
yaml::Mapping::getInt
          (Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Mapping *this,string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  reference_wrapper<const_yaml::Value> *this_00;
  Value *this_01;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_48 [8];
  ExpectedRef<const_Value,_std::string> value_result;
  string *name_local;
  Mapping *this_local;
  
  value_result._32_8_ = name;
  getValue((ExpectedRef<const_Value,_std::string> *)local_48,this,name);
  bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_48);
  if (bVar1) {
    this_00 = Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_48);
    this_01 = std::reference_wrapper<const_yaml::Value>::get(this_00);
    Value::getInt_abi_cxx11_(__return_storage_ptr__,this_01);
  }
  else {
    e = Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error((Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_48);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_78,e);
    Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_78);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_78);
  }
  Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Expected<long int, std::string> Mapping::getInt(const std::string &name) const {
	const auto value_result = getValue(name);
	if (!value_result)
		return Unexpected(value_result.error());

	return value_result.value().get().getInt();
}